

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O2

bool __thiscall spvtools::utils::BitVector::Clear(BitVector *this,uint32_t i)

{
  pointer puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(i >> 6);
  puVar1 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->bits_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    if ((puVar1[uVar2] >> ((ulong)i & 0x3f) & 1) != 0) {
      puVar1[uVar2] = puVar1[uVar2] & ~(1L << ((byte)i & 0x3f));
      return true;
    }
  }
  return false;
}

Assistant:

bool Clear(uint32_t i) {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      return false;
    }

    BitContainer original = bits_[element_index];
    BitContainer ith_bit = static_cast<BitContainer>(1) << bit_in_element;

    if ((original & ith_bit) == 0) {
      return false;
    } else {
      bits_[element_index] = original & (~ith_bit);
      return true;
    }
  }